

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void __thiscall
FIX::double_conversion::FillDigits32
          (double_conversion *this,uint32_t number,Vector<char> buffer,int *length)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  int *piVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  int local_38;
  int iStack_34;
  char tmp;
  int j;
  int i;
  int digit;
  int number_length;
  int *length_local;
  undefined1 auStack_18 [4];
  uint32_t number_local;
  Vector<char> buffer_local;
  
  _auStack_18 = (char *)CONCAT44(in_register_00000034,number);
  piVar4 = buffer._8_8_;
  buffer_local.start_._0_4_ = buffer.start_._0_4_;
  length_local._4_4_ = (uint)this;
  i = 0;
  while (length_local._4_4_ != 0) {
    uVar5 = length_local._4_4_ % 10;
    length_local._4_4_ = length_local._4_4_ / 10;
    pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,*piVar4 + i);
    *pcVar3 = (char)uVar5 + '0';
    i = i + 1;
  }
  local_38 = *piVar4 + i;
  for (iStack_34 = *piVar4; local_38 = local_38 + -1, iStack_34 < local_38;
      iStack_34 = iStack_34 + 1) {
    pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,iStack_34);
    cVar1 = *pcVar3;
    pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,local_38);
    cVar2 = *pcVar3;
    pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,iStack_34);
    *pcVar3 = cVar2;
    pcVar3 = Vector<char>::operator[]((Vector<char> *)auStack_18,local_38);
    *pcVar3 = cVar1;
  }
  *piVar4 = i + *piVar4;
  return;
}

Assistant:

static void FillDigits32(uint32_t number, Vector<char> buffer, int* length) {
  int number_length = 0;
  // We fill the digits in reverse order and exchange them afterwards.
  while (number != 0) {
    int digit = number % 10;
    number /= 10;
    buffer[(*length) + number_length] = static_cast<char>('0' + digit);
    number_length++;
  }
  // Exchange the digits.
  int i = *length;
  int j = *length + number_length - 1;
  while (i < j) {
    char tmp = buffer[i];
    buffer[i] = buffer[j];
    buffer[j] = tmp;
    i++;
    j--;
  }
  *length += number_length;
}